

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O3

RecyclableObject * __thiscall
Js::JavascriptProxy::ToObject(JavascriptProxy *this,ScriptContext *requestContext)

{
  bool bVar1;
  RecyclableObject *pRVar2;
  
  bVar1 = IsRevoked(this);
  if (!bVar1) {
    pRVar2 = RecyclableObject::ToObject((RecyclableObject *)this,requestContext);
    return pRVar2;
  }
  bVar1 = ThreadContext::RecordImplicitException
                    (((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                        javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                     threadContext);
  if (!bVar1) {
    return (RecyclableObject *)0x0;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"toObject");
}

Assistant:

RecyclableObject* JavascriptProxy::ToObject(ScriptContext * requestContext)
    {
        //RecyclableObject* targetObj;
        if (IsRevoked())
        {
            ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return nullptr;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("toObject"));
        }
        return __super::ToObject(requestContext);
    }